

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MainLoop.h
# Opt level: O0

shared_ptr<MainLoop> MainLoop::Init(void)

{
  bool bVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<MainLoop> *in_RDI;
  shared_ptr<MainLoop> sVar2;
  shared_ptr<MainLoop> local_20;
  
  bVar1 = std::operator==(&__MainLoop__,(nullptr_t)0x0);
  if (bVar1) {
    std::make_shared<MainLoop>();
    std::shared_ptr<MainLoop>::operator=(&__MainLoop__,&local_20);
    std::shared_ptr<MainLoop>::~shared_ptr(&local_20);
  }
  std::shared_ptr<MainLoop>::shared_ptr(in_RDI,&__MainLoop__);
  sVar2.super___shared_ptr<MainLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<MainLoop,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)in_RDI;
  return (shared_ptr<MainLoop>)sVar2.super___shared_ptr<MainLoop,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<MainLoop> MainLoop::Init()
{
	if (__MainLoop__ == NULL)
	{
		__MainLoop__ = std::make_shared<MainLoop>();
	}
	return __MainLoop__;
}